

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  uint uVar1;
  global_State *in_RSI;
  global_State *in_RDI;
  IRIns *ir;
  IRRef ref;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((short)(in_RSI->gc).estimate != 0) {
    for (uVar1 = *(uint *)&in_RSI->allocd; uVar1 < 0x7ffd; uVar1 = uVar1 + 1) {
      if (((in_RSI->allocf + (ulong)uVar1 * 8)[5] ==
           (_func_void_ptr_void_ptr_void_ptr_size_t_size_t)0x17) &&
         ((*(byte *)((ulong)*(uint *)(in_RSI->allocf + (ulong)uVar1 * 8) + 4) & 3) != 0)) {
        gc_mark(in_RSI,(GCobj *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
      }
    }
    if (*(short *)((long)&(in_RSI->gc).estimate + 2) != 0) {
      gc_marktrace(in_RDI,(uint)*(ushort *)((long)&(in_RSI->gc).estimate + 2));
    }
    if (*(short *)((long)&(in_RSI->gc).pause + 2) != 0) {
      gc_marktrace(in_RDI,(uint)*(ushort *)((long)&(in_RSI->gc).pause + 2));
    }
    if (*(short *)&(in_RSI->tmpbuf).buf != 0) {
      gc_marktrace(in_RDI,(uint)*(ushort *)&(in_RSI->tmpbuf).buf);
    }
    if ((*(byte *)((ulong)(in_RSI->gc).root.gcptr32 + 4) & 3) != 0) {
      gc_mark(in_RSI,(GCobj *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}